

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Cluster::Cluster(Cluster *this,uint64_t id,Element *element,Document *doc,string *name)

{
  string *this_00;
  bool bVar1;
  Scope *pSVar2;
  Element *pEVar3;
  size_type sVar4;
  size_type sVar5;
  uint64_t dest;
  reference ppCVar6;
  allocator<char> local_241;
  string local_240;
  Model *local_220;
  Model *mod;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_1e0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  aiMatrix4x4 local_184;
  aiMatrix4x4 local_144;
  allocator<char> local_101;
  string local_100;
  Element *local_e0;
  Element *TransformLink;
  string local_d0;
  Element *local_b0;
  Element *Transform;
  string local_a0;
  Element *local_80;
  Element *Weights;
  string local_70;
  Element *local_50;
  Element *Indexes;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  Cluster *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__Cluster_0100d518;
  std::vector<float,_std::allocator<float>_>::vector(&this->weights);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->indices);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->transform);
  aiMatrix4x4t<float>::aiMatrix4x4t(&this->transformLink);
  this->node = (Model *)0x0;
  pSVar2 = GetRequiredScope((Element *)doc_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Indexes",(allocator<char> *)((long)&Weights + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Weights + 7));
  pSVar2 = local_38;
  local_50 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"Weights",(allocator<char> *)((long)&Transform + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&Transform + 7));
  pSVar2 = local_38;
  local_80 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"Transform",(allocator<char> *)((long)&TransformLink + 7));
  pEVar3 = GetRequiredElement(pSVar2,&local_d0,(Element *)doc_local);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&TransformLink + 7));
  pSVar2 = local_38;
  local_b0 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"TransformLink",&local_101);
  pEVar3 = GetRequiredElement(pSVar2,&local_100,(Element *)doc_local);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  local_e0 = pEVar3;
  ReadMatrix(&local_144,local_b0);
  (this->transform).d1 = local_144.d1;
  (this->transform).d2 = local_144.d2;
  (this->transform).d3 = local_144.d3;
  (this->transform).d4 = local_144.d4;
  (this->transform).c1 = local_144.c1;
  (this->transform).c2 = local_144.c2;
  (this->transform).c3 = local_144.c3;
  (this->transform).c4 = local_144.c4;
  (this->transform).b1 = local_144.b1;
  (this->transform).b2 = local_144.b2;
  (this->transform).b3 = local_144.b3;
  (this->transform).b4 = local_144.b4;
  (this->transform).a1 = local_144.a1;
  (this->transform).a2 = local_144.a2;
  (this->transform).a3 = local_144.a3;
  (this->transform).a4 = local_144.a4;
  ReadMatrix(&local_184,local_e0);
  memcpy(&this->transformLink,&local_184,0x40);
  if ((local_50 != (Element *)0x0) != (local_80 != (Element *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,"either Indexes or Weights are missing from Cluster",&local_1a9)
    ;
    Util::DOMError(&local_1a8,(Element *)doc_local);
  }
  if (local_50 != (Element *)0x0) {
    ParseVectorDataArray(&this->indices,local_50);
    ParseVectorDataArray(&this->weights,local_80);
  }
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->indices);
  sVar5 = std::vector<float,_std::allocator<float>_>::size(&this->weights);
  this_00 = name_local;
  if (sVar4 != sVar5) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"sizes of index and weight array don\'t match up",
               (allocator<char> *)((long)&conns + 7));
    Util::DOMError(&local_1d0,(Element *)doc_local);
  }
  dest = FBX::Object::ID((Object *)this);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,(Document *)this_00,dest,"Model");
  local_1e0 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
               *)&__range2;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                    *)&__range2);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
             *)&__range2);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                *)&con);
    if (!bVar1) {
LAB_00a40b2f:
      if (this->node != (Model *)0x0) {
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
                 *)&__range2);
        return;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,"failed to read target Node for Cluster",&local_241);
      Util::DOMError(&local_240,(Element *)doc_local);
    }
    ppCVar6 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    mod = (Model *)*ppCVar6;
    local_220 = Util::ProcessSimpleConnection<Assimp::FBX::Model>
                          ((Connection *)mod,false,"Model -> Cluster",(Element *)doc_local,
                           (char **)0x0);
    if (local_220 != (Model *)0x0) {
      this->node = local_220;
      goto LAB_00a40b2f;
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

Cluster::Cluster(uint64_t id, const Element& element, const Document& doc, const std::string& name)
: Deformer(id,element,doc,name)
, node()
{
    const Scope& sc = GetRequiredScope(element);

    const Element* const Indexes = sc["Indexes"];
    const Element* const Weights = sc["Weights"];

    const Element& Transform = GetRequiredElement(sc,"Transform",&element);
    const Element& TransformLink = GetRequiredElement(sc,"TransformLink",&element);

    transform = ReadMatrix(Transform);
    transformLink = ReadMatrix(TransformLink);

    // it is actually possible that there be Deformer's with no weights
    if (!!Indexes != !!Weights) {
        DOMError("either Indexes or Weights are missing from Cluster",&element);
    }

    if(Indexes) {
        ParseVectorDataArray(indices,*Indexes);
        ParseVectorDataArray(weights,*Weights);
    }

    if(indices.size() != weights.size()) {
        DOMError("sizes of index and weight array don't match up",&element);
    }

    // read assigned node
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(),"Model");
    for(const Connection* con : conns) {
        const Model* const mod = ProcessSimpleConnection<Model>(*con, false, "Model -> Cluster", element);
        if(mod) {
            node = mod;
            break;
        }
    }

    if (!node) {
        DOMError("failed to read target Node for Cluster",&element);
    }
}